

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

bool embree::avx512::
     BVHNIntersector1<4,_1,_false,_embree::avx512::ArrayIntersector1<embree::avx512::QuadMvIntersector1Moeller<4,_true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  uint uVar6;
  uint uVar7;
  Geometry *this;
  bool bVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar23;
  byte bVar24;
  bool bVar25;
  bool bVar26;
  uint uVar27;
  ulong uVar29;
  long lVar30;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar31;
  byte bVar32;
  long lVar33;
  ulong uVar34;
  long lVar35;
  ulong uVar36;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar42 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar43;
  StackItemT<embree::NodeRefPtr<4>_> SVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar50;
  undefined1 auVar51 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar52;
  StackItemT<embree::NodeRefPtr<4>_> SVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  vfloat<4> tNear;
  undefined1 local_1048 [16];
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  ulong uVar28;
  undefined1 auVar40 [16];
  undefined1 auVar37 [16];
  undefined1 auVar41 [16];
  
  stack[0].ptr.ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack[0].ptr.ptr == 8) {
    return false;
  }
  stack[0].dist = 0;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    local_1048 = ZEXT416((uint)(query->radius * query->radius));
  }
  else {
    aVar5 = (context->query_radius).field_0;
    local_1048 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
  }
  pSVar31 = stack + 1;
  fVar1 = (query->p).field_0.field_0.x;
  auVar61._4_4_ = fVar1;
  auVar61._0_4_ = fVar1;
  auVar61._8_4_ = fVar1;
  auVar61._12_4_ = fVar1;
  fVar2 = (query->p).field_0.field_0.y;
  auVar62._4_4_ = fVar2;
  auVar62._0_4_ = fVar2;
  auVar62._8_4_ = fVar2;
  auVar62._12_4_ = fVar2;
  fVar3 = (query->p).field_0.field_0.z;
  auVar63._4_4_ = fVar3;
  auVar63._0_4_ = fVar3;
  auVar63._8_4_ = fVar3;
  auVar63._12_4_ = fVar3;
  uVar4 = *(undefined4 *)&(context->query_radius).field_0;
  auVar54._4_4_ = uVar4;
  auVar54._0_4_ = uVar4;
  auVar54._8_4_ = uVar4;
  auVar54._12_4_ = uVar4;
  uVar4 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
  auVar55._4_4_ = uVar4;
  auVar55._0_4_ = uVar4;
  auVar55._8_4_ = uVar4;
  auVar55._12_4_ = uVar4;
  uVar4 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
  auVar41._4_4_ = uVar4;
  auVar41._0_4_ = uVar4;
  auVar41._8_4_ = uVar4;
  auVar41._12_4_ = uVar4;
  bVar26 = false;
  do {
    auVar13 = vsubps_avx(auVar61,auVar54);
    fVar9 = auVar54._0_4_;
    fVar10 = auVar54._4_4_;
    fVar11 = auVar54._8_4_;
    fVar12 = auVar54._12_4_;
    auVar54 = vsubps_avx(auVar62,auVar55);
    auVar14 = vsubps_avx(auVar63,auVar41);
    auVar56._0_4_ = fVar3 + auVar41._0_4_;
    auVar56._4_4_ = fVar3 + auVar41._4_4_;
    auVar56._8_4_ = fVar3 + auVar41._8_4_;
    auVar56._12_4_ = fVar3 + auVar41._12_4_;
    auVar64._0_4_ = fVar9 * fVar9;
    auVar64._4_4_ = fVar10 * fVar10;
    auVar64._8_4_ = fVar11 * fVar11;
    auVar64._12_4_ = fVar12 * fVar12;
LAB_01bde943:
    do {
      do {
        if (pSVar31 == stack) {
          return bVar26;
        }
        pSVar23 = pSVar31 + -1;
        pSVar31 = pSVar31 + -1;
      } while ((float)local_1048._0_4_ < (float)pSVar23->dist);
      uVar36 = (pSVar31->ptr).ptr;
LAB_01bde969:
      if (context->query_type != POINT_QUERY_TYPE_SPHERE) {
        if ((uVar36 & 8) != 0) goto LAB_01bdec9b;
        auVar41 = *(undefined1 (*) [16])(uVar36 + 0x20);
        auVar39 = *(undefined1 (*) [16])(uVar36 + 0x30);
        auVar15 = vmaxps_avx(auVar61,auVar41);
        auVar15 = vminps_avx(auVar15,auVar39);
        auVar37 = vsubps_avx(auVar15,auVar61);
        auVar15 = vmaxps_avx(auVar62,*(undefined1 (*) [16])(uVar36 + 0x40));
        auVar15 = vminps_avx(auVar15,*(undefined1 (*) [16])(uVar36 + 0x50));
        auVar57 = vsubps_avx(auVar15,auVar62);
        auVar15 = vmaxps_avx(auVar63,*(undefined1 (*) [16])(uVar36 + 0x60));
        auVar15 = vminps_avx(auVar15,*(undefined1 (*) [16])(uVar36 + 0x70));
        auVar15 = vsubps_avx(auVar15,auVar63);
        tNear.field_0.v[1] =
             auVar37._4_4_ * auVar37._4_4_ + auVar57._4_4_ * auVar57._4_4_ +
             auVar15._4_4_ * auVar15._4_4_;
        tNear.field_0.v[0] =
             auVar37._0_4_ * auVar37._0_4_ + auVar57._0_4_ * auVar57._0_4_ +
             auVar15._0_4_ * auVar15._0_4_;
        tNear.field_0.v[2] =
             auVar37._8_4_ * auVar37._8_4_ + auVar57._8_4_ * auVar57._8_4_ +
             auVar15._8_4_ * auVar15._8_4_;
        tNear.field_0.v[3] =
             auVar37._12_4_ * auVar37._12_4_ + auVar57._12_4_ * auVar57._12_4_ +
             auVar15._12_4_ * auVar15._12_4_;
        uVar16 = vcmpps_avx512vl(auVar41,auVar39,2);
        uVar17 = vcmpps_avx512vl(auVar39,auVar13,1);
        auVar15._4_4_ = fVar1 + fVar10;
        auVar15._0_4_ = fVar1 + fVar9;
        auVar15._8_4_ = fVar1 + fVar11;
        auVar15._12_4_ = fVar1 + fVar12;
        uVar18 = vcmpps_avx512vl(auVar41,auVar15,6);
        uVar19 = vcmpps_avx512vl(*(undefined1 (*) [16])(uVar36 + 0x50),auVar54,1);
        auVar39._4_4_ = fVar2 + auVar55._4_4_;
        auVar39._0_4_ = fVar2 + auVar55._0_4_;
        auVar39._8_4_ = fVar2 + auVar55._8_4_;
        auVar39._12_4_ = fVar2 + auVar55._12_4_;
        uVar20 = vcmpps_avx512vl(*(undefined1 (*) [16])(uVar36 + 0x40),auVar39,6);
        uVar21 = vcmpps_avx512vl(*(undefined1 (*) [16])(uVar36 + 0x70),auVar14,1);
        uVar22 = vcmpps_avx512vl(*(undefined1 (*) [16])(uVar36 + 0x60),auVar56,6);
        bVar24 = ~((byte)uVar20 | (byte)uVar18 | (byte)uVar22 | (byte)uVar17 | (byte)uVar19 |
                  (byte)uVar21) & (byte)uVar16;
LAB_01bde9e4:
        if (bVar24 != 0) {
          uVar34 = uVar36 & 0xfffffffffffffff0;
          lVar30 = 0;
          for (uVar36 = (ulong)bVar24; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000)
          {
            lVar30 = lVar30 + 1;
          }
          uVar36 = *(ulong *)(uVar34 + lVar30 * 8);
          uVar27 = bVar24 - 1 & (uint)bVar24;
          uVar28 = (ulong)uVar27;
          if (uVar27 != 0) {
            uVar6 = *(uint *)(local_1048 + lVar30 * 4 + -0x10);
            lVar30 = 0;
            for (; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
              lVar30 = lVar30 + 1;
            }
            uVar27 = uVar27 - 1 & uVar27;
            uVar29 = (ulong)uVar27;
            uVar28 = *(ulong *)(uVar34 + lVar30 * 8);
            uVar7 = *(uint *)(local_1048 + lVar30 * 4 + -0x10);
            if (uVar27 == 0) {
              if (uVar6 < uVar7) {
                (pSVar31->ptr).ptr = uVar28;
                pSVar31->dist = uVar7;
                pSVar31 = pSVar31 + 1;
              }
              else {
                (pSVar31->ptr).ptr = uVar36;
                pSVar31->dist = uVar6;
                pSVar31 = pSVar31 + 1;
                uVar36 = uVar28;
              }
            }
            else {
              auVar37._8_8_ = 0;
              auVar37._0_8_ = uVar36;
              auVar41 = vpunpcklqdq_avx(auVar37,ZEXT416(uVar6));
              auVar57._8_8_ = 0;
              auVar57._0_8_ = uVar28;
              auVar39 = vpunpcklqdq_avx(auVar57,ZEXT416(uVar7));
              lVar30 = 0;
              for (; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
                lVar30 = lVar30 + 1;
              }
              uVar27 = uVar27 - 1 & uVar27;
              uVar36 = (ulong)uVar27;
              auVar58._8_8_ = 0;
              auVar58._0_8_ = *(ulong *)(uVar34 + lVar30 * 8);
              auVar58 = vpunpcklqdq_avx(auVar58,ZEXT416(*(uint *)(local_1048 + lVar30 * 4 + -0x10)))
              ;
              auVar15 = vpshufd_avx(auVar41,0xaa);
              auVar37 = vpshufd_avx(auVar39,0xaa);
              auVar57 = vpshufd_avx(auVar58,0xaa);
              if (uVar27 == 0) {
                uVar36 = vpcmpgtd_avx512vl(auVar37,auVar15);
                uVar36 = uVar36 & 0xf;
                auVar37 = vpblendmd_avx512vl(auVar39,auVar41);
                bVar25 = (bool)((byte)uVar36 & 1);
                auVar38._0_4_ = (uint)bVar25 * auVar37._0_4_ | (uint)!bVar25 * auVar15._0_4_;
                bVar25 = (bool)((byte)(uVar36 >> 1) & 1);
                auVar38._4_4_ = (uint)bVar25 * auVar37._4_4_ | (uint)!bVar25 * auVar15._4_4_;
                bVar25 = (bool)((byte)(uVar36 >> 2) & 1);
                auVar38._8_4_ = (uint)bVar25 * auVar37._8_4_ | (uint)!bVar25 * auVar15._8_4_;
                bVar25 = SUB81(uVar36 >> 3,0);
                auVar38._12_4_ = (uint)bVar25 * auVar37._12_4_ | (uint)!bVar25 * auVar15._12_4_;
                auVar39 = vmovdqa32_avx512vl(auVar39);
                bVar25 = (bool)((byte)uVar36 & 1);
                auVar40._0_4_ = (uint)bVar25 * auVar39._0_4_ | (uint)!bVar25 * auVar41._0_4_;
                bVar25 = (bool)((byte)(uVar36 >> 1) & 1);
                auVar40._4_4_ = (uint)bVar25 * auVar39._4_4_ | (uint)!bVar25 * auVar41._4_4_;
                bVar25 = (bool)((byte)(uVar36 >> 2) & 1);
                auVar40._8_4_ = (uint)bVar25 * auVar39._8_4_ | (uint)!bVar25 * auVar41._8_4_;
                bVar25 = SUB81(uVar36 >> 3,0);
                auVar40._12_4_ = (uint)bVar25 * auVar39._12_4_ | (uint)!bVar25 * auVar41._12_4_;
                auVar41 = vpshufd_avx(auVar38,0xaa);
                uVar34 = vpcmpgtd_avx512vl(auVar57,auVar41);
                uVar34 = uVar34 & 0xf;
                auVar39 = vpblendmd_avx512vl(auVar58,auVar38);
                bVar25 = (bool)((byte)uVar34 & 1);
                bVar8 = (bool)((byte)(uVar34 >> 1) & 1);
                uVar36 = CONCAT44((uint)bVar8 * auVar39._4_4_ | (uint)!bVar8 * auVar41._4_4_,
                                  (uint)bVar25 * auVar39._0_4_ | (uint)!bVar25 * auVar41._0_4_);
                auVar41 = vmovdqa32_avx512vl(auVar58);
                bVar25 = (bool)((byte)uVar34 & 1);
                auVar42._0_4_ = (uint)bVar25 * auVar41._0_4_ | !bVar25 * auVar38._0_4_;
                bVar25 = (bool)((byte)(uVar34 >> 1) & 1);
                auVar42._4_4_ = (uint)bVar25 * auVar41._4_4_ | !bVar25 * auVar38._4_4_;
                bVar25 = (bool)((byte)(uVar34 >> 2) & 1);
                auVar42._8_4_ = (uint)bVar25 * auVar41._8_4_ | !bVar25 * auVar38._8_4_;
                bVar25 = SUB81(uVar34 >> 3,0);
                auVar42._12_4_ = (uint)bVar25 * auVar41._12_4_ | !bVar25 * auVar38._12_4_;
                auVar41 = vpshufd_avx(auVar42,0xaa);
                auVar39 = vpshufd_avx(auVar40,0xaa);
                uVar34 = vpcmpgtd_avx512vl(auVar41,auVar39);
                uVar34 = uVar34 & 0xf;
                auVar39 = vpblendmd_avx512vl(auVar42,auVar40);
                bVar25 = (bool)((byte)uVar34 & 1);
                SVar43.ptr.ptr._0_4_ = (uint)bVar25 * auVar39._0_4_ | (uint)!bVar25 * auVar41._0_4_;
                bVar25 = (bool)((byte)(uVar34 >> 1) & 1);
                SVar43.ptr.ptr._4_4_ = (uint)bVar25 * auVar39._4_4_ | (uint)!bVar25 * auVar41._4_4_;
                bVar25 = (bool)((byte)(uVar34 >> 2) & 1);
                SVar43.dist = (uint)bVar25 * auVar39._8_4_ | (uint)!bVar25 * auVar41._8_4_;
                bVar25 = SUB81(uVar34 >> 3,0);
                SVar43._12_4_ = (uint)bVar25 * auVar39._12_4_ | (uint)!bVar25 * auVar41._12_4_;
                auVar41 = vmovdqa32_avx512vl(auVar42);
                bVar25 = (bool)((byte)uVar34 & 1);
                SVar44.ptr.ptr._0_4_ = (uint)bVar25 * auVar41._0_4_ | !bVar25 * auVar40._0_4_;
                bVar25 = (bool)((byte)(uVar34 >> 1) & 1);
                SVar44.ptr.ptr._4_4_ = (uint)bVar25 * auVar41._4_4_ | !bVar25 * auVar40._4_4_;
                bVar25 = (bool)((byte)(uVar34 >> 2) & 1);
                SVar44.dist = (uint)bVar25 * auVar41._8_4_ | !bVar25 * auVar40._8_4_;
                bVar25 = SUB81(uVar34 >> 3,0);
                SVar44._12_4_ = (uint)bVar25 * auVar41._12_4_ | !bVar25 * auVar40._12_4_;
                *pSVar31 = SVar44;
                pSVar31[1] = SVar43;
                pSVar31 = pSVar31 + 2;
              }
              else {
                lVar30 = 0;
                for (; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
                  lVar30 = lVar30 + 1;
                }
                uVar27 = *(uint *)(local_1048 + lVar30 * 4 + -0x10);
                auVar60._8_8_ = 0;
                auVar60._0_8_ = *(ulong *)(uVar34 + lVar30 * 8);
                auVar48 = vpunpcklqdq_avx(auVar60,ZEXT416(uVar27));
                uVar36 = vpcmpgtd_avx512vl(auVar37,auVar15);
                uVar36 = uVar36 & 0xf;
                auVar37 = vpblendmd_avx512vl(auVar39,auVar41);
                bVar25 = (bool)((byte)uVar36 & 1);
                auVar45._0_4_ = (uint)bVar25 * auVar37._0_4_ | (uint)!bVar25 * auVar15._0_4_;
                bVar25 = (bool)((byte)(uVar36 >> 1) & 1);
                auVar45._4_4_ = (uint)bVar25 * auVar37._4_4_ | (uint)!bVar25 * auVar15._4_4_;
                bVar25 = (bool)((byte)(uVar36 >> 2) & 1);
                auVar45._8_4_ = (uint)bVar25 * auVar37._8_4_ | (uint)!bVar25 * auVar15._8_4_;
                bVar25 = SUB81(uVar36 >> 3,0);
                auVar45._12_4_ = (uint)bVar25 * auVar37._12_4_ | (uint)!bVar25 * auVar15._12_4_;
                auVar39 = vmovdqa32_avx512vl(auVar39);
                bVar25 = (bool)((byte)uVar36 & 1);
                auVar46._0_4_ = (uint)bVar25 * auVar39._0_4_ | (uint)!bVar25 * auVar41._0_4_;
                bVar25 = (bool)((byte)(uVar36 >> 1) & 1);
                auVar46._4_4_ = (uint)bVar25 * auVar39._4_4_ | (uint)!bVar25 * auVar41._4_4_;
                bVar25 = (bool)((byte)(uVar36 >> 2) & 1);
                auVar46._8_4_ = (uint)bVar25 * auVar39._8_4_ | (uint)!bVar25 * auVar41._8_4_;
                bVar25 = SUB81(uVar36 >> 3,0);
                auVar46._12_4_ = (uint)bVar25 * auVar39._12_4_ | (uint)!bVar25 * auVar41._12_4_;
                auVar59._4_4_ = uVar27;
                auVar59._0_4_ = uVar27;
                auVar59._8_4_ = uVar27;
                auVar59._12_4_ = uVar27;
                uVar36 = vpcmpgtd_avx512vl(auVar59,auVar57);
                uVar36 = uVar36 & 0xf;
                auVar41 = vpblendmd_avx512vl(auVar48,auVar58);
                bVar25 = (bool)((byte)uVar36 & 1);
                auVar47._0_4_ = (uint)bVar25 * auVar41._0_4_ | !bVar25 * uVar27;
                bVar25 = (bool)((byte)(uVar36 >> 1) & 1);
                auVar47._4_4_ = (uint)bVar25 * auVar41._4_4_ | !bVar25 * uVar27;
                bVar25 = (bool)((byte)(uVar36 >> 2) & 1);
                auVar47._8_4_ = (uint)bVar25 * auVar41._8_4_ | !bVar25 * uVar27;
                bVar25 = SUB81(uVar36 >> 3,0);
                auVar47._12_4_ = (uint)bVar25 * auVar41._12_4_ | !bVar25 * uVar27;
                auVar41 = vmovdqa32_avx512vl(auVar48);
                bVar25 = (bool)((byte)uVar36 & 1);
                auVar48._0_4_ = (uint)bVar25 * auVar41._0_4_ | (uint)!bVar25 * auVar58._0_4_;
                bVar25 = (bool)((byte)(uVar36 >> 1) & 1);
                auVar48._4_4_ = (uint)bVar25 * auVar41._4_4_ | (uint)!bVar25 * auVar58._4_4_;
                bVar25 = (bool)((byte)(uVar36 >> 2) & 1);
                auVar48._8_4_ = (uint)bVar25 * auVar41._8_4_ | (uint)!bVar25 * auVar58._8_4_;
                bVar25 = SUB81(uVar36 >> 3,0);
                auVar48._12_4_ = (uint)bVar25 * auVar41._12_4_ | (uint)!bVar25 * auVar58._12_4_;
                auVar41 = vpshufd_avx(auVar48,0xaa);
                auVar39 = vpshufd_avx(auVar46,0xaa);
                uVar36 = vpcmpgtd_avx512vl(auVar41,auVar39);
                uVar36 = uVar36 & 0xf;
                auVar39 = vpblendmd_avx512vl(auVar48,auVar46);
                bVar25 = (bool)((byte)uVar36 & 1);
                auVar49._0_4_ = (uint)bVar25 * auVar39._0_4_ | (uint)!bVar25 * auVar41._0_4_;
                bVar25 = (bool)((byte)(uVar36 >> 1) & 1);
                auVar49._4_4_ = (uint)bVar25 * auVar39._4_4_ | (uint)!bVar25 * auVar41._4_4_;
                bVar25 = (bool)((byte)(uVar36 >> 2) & 1);
                auVar49._8_4_ = (uint)bVar25 * auVar39._8_4_ | (uint)!bVar25 * auVar41._8_4_;
                bVar25 = SUB81(uVar36 >> 3,0);
                auVar49._12_4_ = (uint)bVar25 * auVar39._12_4_ | (uint)!bVar25 * auVar41._12_4_;
                auVar41 = vmovdqa32_avx512vl(auVar48);
                bVar25 = (bool)((byte)uVar36 & 1);
                SVar50.ptr.ptr._0_4_ = (uint)bVar25 * auVar41._0_4_ | !bVar25 * auVar46._0_4_;
                bVar25 = (bool)((byte)(uVar36 >> 1) & 1);
                SVar50.ptr.ptr._4_4_ = (uint)bVar25 * auVar41._4_4_ | !bVar25 * auVar46._4_4_;
                bVar25 = (bool)((byte)(uVar36 >> 2) & 1);
                SVar50.dist = (uint)bVar25 * auVar41._8_4_ | !bVar25 * auVar46._8_4_;
                bVar25 = SUB81(uVar36 >> 3,0);
                SVar50._12_4_ = (uint)bVar25 * auVar41._12_4_ | !bVar25 * auVar46._12_4_;
                auVar41 = vpshufd_avx(auVar47,0xaa);
                auVar39 = vpshufd_avx(auVar45,0xaa);
                uVar34 = vpcmpgtd_avx512vl(auVar41,auVar39);
                uVar34 = uVar34 & 0xf;
                auVar39 = vpblendmd_avx512vl(auVar47,auVar45);
                bVar25 = (bool)((byte)uVar34 & 1);
                bVar8 = (bool)((byte)(uVar34 >> 1) & 1);
                uVar36 = CONCAT44((uint)bVar8 * auVar39._4_4_ | (uint)!bVar8 * auVar41._4_4_,
                                  (uint)bVar25 * auVar39._0_4_ | (uint)!bVar25 * auVar41._0_4_);
                auVar41 = vmovdqa32_avx512vl(auVar47);
                bVar25 = (bool)((byte)uVar34 & 1);
                auVar51._0_4_ = (uint)bVar25 * auVar41._0_4_ | !bVar25 * auVar45._0_4_;
                bVar25 = (bool)((byte)(uVar34 >> 1) & 1);
                auVar51._4_4_ = (uint)bVar25 * auVar41._4_4_ | !bVar25 * auVar45._4_4_;
                bVar25 = (bool)((byte)(uVar34 >> 2) & 1);
                auVar51._8_4_ = (uint)bVar25 * auVar41._8_4_ | !bVar25 * auVar45._8_4_;
                bVar25 = SUB81(uVar34 >> 3,0);
                auVar51._12_4_ = (uint)bVar25 * auVar41._12_4_ | !bVar25 * auVar45._12_4_;
                auVar41 = vpshufd_avx(auVar51,0xaa);
                auVar39 = vpshufd_avx(auVar49,0xaa);
                uVar34 = vpcmpgtd_avx512vl(auVar39,auVar41);
                uVar34 = uVar34 & 0xf;
                auVar39 = vpblendmd_avx512vl(auVar49,auVar51);
                bVar25 = (bool)((byte)uVar34 & 1);
                SVar52.ptr.ptr._0_4_ = (uint)bVar25 * auVar39._0_4_ | (uint)!bVar25 * auVar41._0_4_;
                bVar25 = (bool)((byte)(uVar34 >> 1) & 1);
                SVar52.ptr.ptr._4_4_ = (uint)bVar25 * auVar39._4_4_ | (uint)!bVar25 * auVar41._4_4_;
                bVar25 = (bool)((byte)(uVar34 >> 2) & 1);
                SVar52.dist = (uint)bVar25 * auVar39._8_4_ | (uint)!bVar25 * auVar41._8_4_;
                bVar25 = SUB81(uVar34 >> 3,0);
                SVar52._12_4_ = (uint)bVar25 * auVar39._12_4_ | (uint)!bVar25 * auVar41._12_4_;
                auVar41 = vmovdqa32_avx512vl(auVar49);
                bVar25 = (bool)((byte)uVar34 & 1);
                SVar53.ptr.ptr._0_4_ = (uint)bVar25 * auVar41._0_4_ | !bVar25 * auVar51._0_4_;
                bVar25 = (bool)((byte)(uVar34 >> 1) & 1);
                SVar53.ptr.ptr._4_4_ = (uint)bVar25 * auVar41._4_4_ | !bVar25 * auVar51._4_4_;
                bVar25 = (bool)((byte)(uVar34 >> 2) & 1);
                SVar53.dist = (uint)bVar25 * auVar41._8_4_ | !bVar25 * auVar51._8_4_;
                bVar25 = SUB81(uVar34 >> 3,0);
                SVar53._12_4_ = (uint)bVar25 * auVar41._12_4_ | !bVar25 * auVar51._12_4_;
                *pSVar31 = SVar50;
                pSVar31[1] = SVar53;
                pSVar31[2] = SVar52;
                pSVar31 = pSVar31 + 3;
              }
            }
          }
          goto LAB_01bde969;
        }
        goto LAB_01bde943;
      }
      if ((uVar36 & 8) == 0) {
        auVar41 = vmaxps_avx(auVar61,*(undefined1 (*) [16])(uVar36 + 0x20));
        auVar39 = vminps_avx(auVar41,*(undefined1 (*) [16])(uVar36 + 0x30));
        auVar41 = vmaxps_avx(auVar62,*(undefined1 (*) [16])(uVar36 + 0x40));
        auVar39 = vsubps_avx(auVar39,auVar61);
        auVar41 = vminps_avx(auVar41,*(undefined1 (*) [16])(uVar36 + 0x50));
        auVar15 = vsubps_avx(auVar41,auVar62);
        auVar41 = vmaxps_avx(auVar63,*(undefined1 (*) [16])(uVar36 + 0x60));
        auVar41 = vminps_avx(auVar41,*(undefined1 (*) [16])(uVar36 + 0x70));
        auVar41 = vsubps_avx(auVar41,auVar63);
        tNear.field_0.v[0] =
             auVar39._0_4_ * auVar39._0_4_ + auVar15._0_4_ * auVar15._0_4_ +
             auVar41._0_4_ * auVar41._0_4_;
        tNear.field_0.v[1] =
             auVar39._4_4_ * auVar39._4_4_ + auVar15._4_4_ * auVar15._4_4_ +
             auVar41._4_4_ * auVar41._4_4_;
        tNear.field_0.v[2] =
             auVar39._8_4_ * auVar39._8_4_ + auVar15._8_4_ * auVar15._8_4_ +
             auVar41._8_4_ * auVar41._8_4_;
        tNear.field_0.v[3] =
             auVar39._12_4_ * auVar39._12_4_ + auVar15._12_4_ * auVar15._12_4_ +
             auVar41._12_4_ * auVar41._12_4_;
        uVar16 = vcmpps_avx512vl((undefined1  [16])tNear.field_0,auVar64,2);
        uVar17 = vcmpps_avx512vl(*(undefined1 (*) [16])(uVar36 + 0x20),
                                 *(undefined1 (*) [16])(uVar36 + 0x30),2);
        bVar24 = (byte)uVar16 & (byte)uVar17;
        goto LAB_01bde9e4;
      }
LAB_01bdec9b:
      lVar35 = (uVar36 & 0xfffffffffffffff0) + 0xd0;
      bVar24 = 0;
      for (lVar30 = 0; lVar30 != (ulong)((uint)uVar36 & 0xf) - 8; lVar30 = lVar30 + 1) {
        bVar32 = 0;
        for (lVar33 = -0x10; lVar33 != 0; lVar33 = lVar33 + 4) {
          uVar27 = *(uint *)(lVar35 + lVar33);
          if ((ulong)uVar27 == 0xffffffff) break;
          this = (context->scene->geometries).items[uVar27].ptr;
          context->geomID = uVar27;
          context->primID = *(uint *)(lVar35 + 0x10 + lVar33);
          bVar25 = Geometry::pointQuery(this,query,context);
          bVar32 = bVar32 | bVar25;
        }
        bVar24 = bVar24 | bVar32;
        lVar35 = lVar35 + 0xe0;
      }
    } while (bVar24 == 0);
    uVar4 = *(undefined4 *)&(context->query_radius).field_0;
    auVar54._4_4_ = uVar4;
    auVar54._0_4_ = uVar4;
    auVar54._8_4_ = uVar4;
    auVar54._12_4_ = uVar4;
    uVar4 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
    auVar55._4_4_ = uVar4;
    auVar55._0_4_ = uVar4;
    auVar55._8_4_ = uVar4;
    auVar55._12_4_ = uVar4;
    uVar4 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
    auVar41._4_4_ = uVar4;
    auVar41._0_4_ = uVar4;
    auVar41._8_4_ = uVar4;
    auVar41._12_4_ = uVar4;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      local_1048 = ZEXT416((uint)(query->radius * query->radius));
    }
    else {
      aVar5 = (context->query_radius).field_0;
      local_1048 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
    }
    bVar26 = true;
  } while( true );
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }